

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra.c
# Opt level: O3

void Gia_ManInsertState(Gia_ManEra_t *p,Gia_ObjEra_t *pState)

{
  Gia_Man_t *pGVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  
  pGVar1 = p->pAig;
  iVar2 = pGVar1->nRegs;
  if (0 < iVar2) {
    uVar3 = 0;
    do {
      iVar5 = pGVar1->vCis->nSize;
      uVar4 = (iVar5 - iVar2) + uVar3;
      if (((int)uVar4 < 0) || (iVar5 <= (int)uVar4)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar2 = pGVar1->vCis->pArray[uVar4];
      if (((long)iVar2 < 0) || (pGVar1->nObjs <= iVar2)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pGVar1->pObjs == (Gia_Obj_t *)0x0) {
        return;
      }
      if (((uint)(&pState[1].Num)[uVar3 >> 5] >> (uVar3 & 0x1f) & 1) == 0) {
        iVar5 = 0;
      }
      else {
        iVar5 = 0xff;
      }
      memset(p->pDataSim + (long)iVar2 * (long)p->nWordsSim,iVar5,(long)p->nWordsSim << 2);
      uVar3 = uVar3 + 1;
      pGVar1 = p->pAig;
      iVar2 = pGVar1->nRegs;
    } while ((int)uVar3 < iVar2);
  }
  return;
}

Assistant:

void Gia_ManInsertState( Gia_ManEra_t * p, Gia_ObjEra_t * pState )
{
    Gia_Obj_t * pObj;
    unsigned * pSimInfo;
    int i;
    Gia_ManForEachRo( p->pAig, pObj, i )
    {
        pSimInfo = Gia_ManEraData( p, Gia_ObjId(p->pAig, pObj) );
        if ( Abc_InfoHasBit(pState->pData, i) )
            memset( pSimInfo, 0xff, sizeof(unsigned) * p->nWordsSim );
        else
            memset( pSimInfo, 0, sizeof(unsigned) * p->nWordsSim );
    }
}